

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniaudio.h
# Opt level: O0

ma_result ma_paged_audio_buffer__data_source_on_get_data_format
                    (ma_data_source *pDataSource,ma_format *pFormat,ma_uint32 *pChannels,
                    ma_uint32 *pSampleRate,ma_channel *pChannelMap,size_t channelMapCap)

{
  undefined4 *in_RCX;
  undefined4 *in_RDX;
  undefined4 *in_RSI;
  long in_RDI;
  ma_channel *in_R8;
  size_t in_R9;
  ma_paged_audio_buffer *pPagedAudioBuffer;
  
  *in_RSI = **(undefined4 **)(in_RDI + 0x48);
  *in_RDX = *(undefined4 *)(*(long *)(in_RDI + 0x48) + 4);
  *in_RCX = 0;
  ma_channel_map_init_standard
            ((ma_standard_channel_map)((ulong)in_RCX >> 0x20),in_R8,in_R9,
             (ma_uint32)((ulong)in_RDI >> 0x20));
  return MA_SUCCESS;
}

Assistant:

static ma_result ma_paged_audio_buffer__data_source_on_get_data_format(ma_data_source* pDataSource, ma_format* pFormat, ma_uint32* pChannels, ma_uint32* pSampleRate, ma_channel* pChannelMap, size_t channelMapCap)
{
    ma_paged_audio_buffer* pPagedAudioBuffer = (ma_paged_audio_buffer*)pDataSource;

    *pFormat     = pPagedAudioBuffer->pData->format;
    *pChannels   = pPagedAudioBuffer->pData->channels;
    *pSampleRate = 0;   /* There is no notion of a sample rate with audio buffers. */
    ma_channel_map_init_standard(ma_standard_channel_map_default, pChannelMap, channelMapCap, pPagedAudioBuffer->pData->channels);

    return MA_SUCCESS;
}